

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O0

shared_ptr<const_CBlock> __thiscall
validation_block_tests::MinerTestingSetup::GoodBlock(MinerTestingSetup *this,uint256 *prev_hash)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_CBlock> sVar2;
  shared_ptr<CBlock> *in_stack_00000010;
  MinerTestingSetup *in_stack_00000018;
  uint256 *in_stack_00000020;
  MinerTestingSetup *in_stack_00000028;
  shared_ptr<CBlock> *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Block(in_stack_00000028,in_stack_00000020);
  FinalizeBlock(in_stack_00000018,in_stack_00000010);
  std::shared_ptr<CBlock_const>::shared_ptr<CBlock,void>
            ((shared_ptr<const_CBlock> *)in_stack_ffffffffffffff78,(shared_ptr<CBlock> *)0xcb4070);
  std::shared_ptr<CBlock>::~shared_ptr(in_stack_ffffffffffffff78);
  std::shared_ptr<CBlock>::~shared_ptr(in_stack_ffffffffffffff78);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    sVar2.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar2.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
    return (shared_ptr<const_CBlock>)
           sVar2.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

std::shared_ptr<const CBlock> MinerTestingSetup::GoodBlock(const uint256& prev_hash)
{
    return FinalizeBlock(Block(prev_hash));
}